

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O1

list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *
beagleGetFactoryList_abi_cxx11_(void)

{
  _List_node_base *p_Var1;
  _List_iterator<beagle::BeagleImplFactory_*> _Var2;
  list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *__x;
  _List_node_base *p_Var3;
  list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> factories;
  _List_iterator<beagle::BeagleImplFactory_*> local_40;
  
  if (implFactory_abi_cxx11_ ==
      (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x0) {
    implFactory_abi_cxx11_ =
         (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
         operator_new(0x18);
    ((_List_node_base *)implFactory_abi_cxx11_)->_M_prev = (_List_node_base *)implFactory_abi_cxx11_
    ;
    ((_List_node_base *)implFactory_abi_cxx11_)->_M_next = (_List_node_base *)implFactory_abi_cxx11_
    ;
    ((_List_node_base *)((long)implFactory_abi_cxx11_ + 0x10))->_M_next = (_List_node_base *)0x0;
    p_Var3 = (plugins_abi_cxx11_->
             super__List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var3 != (_List_node_base *)plugins_abi_cxx11_) {
      do {
        __x = (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
              (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x10))();
        std::__cxx11::
        list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::list
                  ((list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
                    *)&local_40,__x);
        std::__cxx11::list<beagle::BeagleImplFactory*,std::allocator<beagle::BeagleImplFactory*>>::
        insert<std::_List_iterator<beagle::BeagleImplFactory*>,void>
                  ((list<beagle::BeagleImplFactory*,std::allocator<beagle::BeagleImplFactory*>> *)
                   implFactory_abi_cxx11_,(const_iterator)implFactory_abi_cxx11_,local_40,
                   (_List_node_base *)&local_40);
        _Var2._M_node = local_40._M_node;
        while (_Var2._M_node != (_List_node_base *)&local_40) {
          p_Var1 = (_Var2._M_node)->_M_next;
          operator_delete(_Var2._M_node);
          _Var2._M_node = p_Var1;
        }
        p_Var3 = (((_List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>
                    *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var3 != (_List_node_base *)plugins_abi_cxx11_);
    }
  }
  return implFactory_abi_cxx11_;
}

Assistant:

std::list<beagle::BeagleImplFactory*>* beagleGetFactoryList(void) {
    if (implFactory == NULL) {
        implFactory = new std::list<beagle::BeagleImplFactory*>;
        // Set-up a list of implementation factories in trial-order
        std::list<beagle::plugin::Plugin*>::iterator plugin_iter = plugins->begin();
        for(; plugin_iter != plugins->end(); plugin_iter++ ){
            std::list<beagle::BeagleImplFactory*> factories = (*plugin_iter)->getBeagleFactories();
            implFactory->insert(implFactory->end(), factories.begin(), factories.end());
        }
    }
    return implFactory;
}